

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtAxisSweep3Internal.h
# Opt level: O3

void __thiscall
cbtAxisSweep3Internal<unsigned_short>::sortMinDown
          (cbtAxisSweep3Internal<unsigned_short> *this,int axis,unsigned_short edge,
          cbtDispatcher *param_3,bool updateOverlaps)

{
  short *psVar1;
  Edge EVar2;
  cbtOverlappingPairCallback *pcVar3;
  ushort uVar4;
  ulong uVar5;
  uint uVar6;
  undefined6 in_register_00000012;
  long lVar7;
  Edge *pEVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  
  lVar11 = (long)axis;
  uVar5 = CONCAT62(in_register_00000012,edge) & 0xffffffff;
  pEVar8 = this->m_pEdges[lVar11];
  uVar4 = pEVar8[uVar5 - 1].m_pos;
  if (pEVar8[uVar5].m_pos < uVar4) {
    pEVar8 = pEVar8 + uVar5;
    lVar12 = (long)(this->m_pHandles->super_cbtBroadphaseProxy).m_aabbMin.m_floats +
             ((ulong)((uint)pEVar8->m_handle * 0x48) - 0x14);
    uVar6 = 1 << (axis & 0x1fU) & 3;
    uVar9 = 1 << uVar6 & 3;
    do {
      lVar7 = 0x34;
      lVar10 = (long)(this->m_pHandles->super_cbtBroadphaseProxy).m_aabbMin.m_floats +
               ((ulong)((uint)pEVar8[-1].m_handle * 0x48) - 0x14);
      if ((uVar4 & 1) != 0) {
        lVar7 = 0x3a;
      }
      if ((((((byte)uVar4 & 1 & updateOverlaps) == 1) &&
           (lVar7 = 0x3a,
           *(ushort *)(lVar10 + 0x34 + (ulong)(uVar6 * 2)) <=
           *(ushort *)(lVar12 + 0x3a + (ulong)(uVar6 * 2)))) &&
          (*(ushort *)(lVar12 + 0x34 + (ulong)(uVar6 * 2)) <=
           *(ushort *)(lVar10 + 0x3a + (ulong)(uVar6 * 2)))) &&
         ((uVar5 = (ulong)(uVar9 * 2),
          *(ushort *)(lVar10 + 0x34 + uVar5) <= *(ushort *)(lVar12 + 0x3a + uVar5) &&
          (uVar5 = (ulong)(uVar9 * 2),
          *(ushort *)(lVar12 + 0x34 + uVar5) <= *(ushort *)(lVar10 + 0x3a + uVar5))))) {
        (*(this->m_pairCache->super_cbtOverlappingPairCallback)._vptr_cbtOverlappingPairCallback[2])
                  (this->m_pairCache,lVar12,lVar10);
        pcVar3 = this->m_userPairCallback;
        if (pcVar3 != (cbtOverlappingPairCallback *)0x0) {
          (*pcVar3->_vptr_cbtOverlappingPairCallback[2])(pcVar3,lVar12,lVar10);
        }
      }
      psVar1 = (short *)(lVar10 + lVar7 + lVar11 * 2);
      *psVar1 = *psVar1 + 1;
      psVar1 = (short *)(lVar12 + 0x34 + lVar11 * 2);
      *psVar1 = *psVar1 + -1;
      EVar2 = *pEVar8;
      *pEVar8 = pEVar8[-1];
      pEVar8[-1] = EVar2;
      uVar4 = pEVar8[-2].m_pos;
      pEVar8 = pEVar8 + -1;
    } while (EVar2.m_pos < uVar4);
  }
  return;
}

Assistant:

void cbtAxisSweep3Internal<BP_FP_INT_TYPE>::sortMinDown(int axis, BP_FP_INT_TYPE edge, cbtDispatcher* /* dispatcher */, bool updateOverlaps)
{
	Edge* pEdge = m_pEdges[axis] + edge;
	Edge* pPrev = pEdge - 1;
	Handle* pHandleEdge = getHandle(pEdge->m_handle);

	while (pEdge->m_pos < pPrev->m_pos)
	{
		Handle* pHandlePrev = getHandle(pPrev->m_handle);

		if (pPrev->IsMax())
		{
			// if previous edge is a maximum check the bounds and add an overlap if necessary
			const int axis1 = (1 << axis) & 3;
			const int axis2 = (1 << axis1) & 3;
			if (updateOverlaps && testOverlap2D(pHandleEdge, pHandlePrev, axis1, axis2))
			{
				m_pairCache->addOverlappingPair(pHandleEdge, pHandlePrev);
				if (m_userPairCallback)
					m_userPairCallback->addOverlappingPair(pHandleEdge, pHandlePrev);

				//AddOverlap(pEdge->m_handle, pPrev->m_handle);
			}

			// update edge reference in other handle
			pHandlePrev->m_maxEdges[axis]++;
		}
		else
			pHandlePrev->m_minEdges[axis]++;

		pHandleEdge->m_minEdges[axis]--;

		// swap the edges
		Edge swap = *pEdge;
		*pEdge = *pPrev;
		*pPrev = swap;

		// decrement
		pEdge--;
		pPrev--;
	}

#ifdef DEBUG_BROADPHASE
	debugPrintAxis(axis);
#endif  //DEBUG_BROADPHASE
}